

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::EscapeKdoc_abi_cxx11_
          (string *__return_storage_ptr__,java *this,string_view input)

{
  java jVar1;
  java jVar2;
  java *pjVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pjVar3 = (java *)0x0;
  jVar2 = (java)0x61;
  do {
    if (this == pjVar3) {
      return __return_storage_ptr__;
    }
    jVar1 = pjVar3[input._M_len];
    if (jVar1 == (java)0x2f) {
      if (jVar2 != (java)0x2a) goto LAB_00280b8f;
LAB_00280b78:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if ((jVar1 == (java)0x2a) && (jVar2 == (java)0x2f)) goto LAB_00280b78;
LAB_00280b8f:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pjVar3 = pjVar3 + 1;
    jVar2 = jVar1;
  } while( true );
}

Assistant:

static std::string EscapeKdoc(absl::string_view input) {
  std::string result;
  result.reserve(input.size() * 2);

  char prev = 'a';

  for (char c : input) {
    switch (c) {
      case '*':
        // Avoid "/*".
        if (prev == '/') {
          result.append("&#42;");
        } else {
          result.push_back(c);
        }
        break;
      case '/':
        // Avoid "*/".
        if (prev == '*') {
          result.append("&#47;");
        } else {
          result.push_back(c);
        }
        break;
      default:
        result.push_back(c);
        break;
    }

    prev = c;
  }

  return result;
}